

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O3

ConstantFP * LLVMBC::cast<LLVMBC::ConstantFP>(Value *value)

{
  ValueKind VVar1;
  Value *this;
  LoggingCallback p_Var2;
  void *pvVar3;
  char buffer [4096];
  char acStack_1018 [4104];
  
  this = Internal::resolve_proxy(value);
  VVar1 = Value::get_value_kind(this);
  if (VVar1 == ConstantFP) {
    return (ConstantFP *)this;
  }
  p_Var2 = ::dxil_spv::get_thread_log_callback();
  if (p_Var2 == (LoggingCallback)0x0) {
    cast<LLVMBC::ConstantFP>();
    std::terminate();
  }
  builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
  pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var2)(pvVar3,Error,acStack_1018);
  std::terminate();
}

Assistant:

inline const T *cast(const Value *value)
{
	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
	{
		LOGE("Invalid type ID in cast<T>.\n");
		std::terminate();
	}
}